

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O2

void CESkyCoord::ICRS2CIRS(CESkyCoord *in_icrs,CESkyCoord *out_cirs,CEDate *date)

{
  double dVar1;
  CEAngle CVar2;
  double return_dec;
  double return_ra;
  double tdb2;
  double tdb1;
  double eo;
  double local_f0;
  double local_e8;
  CEAngle local_e0;
  double local_d0;
  CEAngle local_c8;
  double local_b8;
  double local_b0;
  CEDate local_a8;
  CEDate local_68;
  undefined1 local_28 [8];
  
  local_b0 = 0.0;
  local_b8 = 0.0;
  (*date->_vptr_CEDate[5])(date);
  CEDate::UTC2TDB((double *)&local_68,&local_b0,&local_b8);
  local_e8 = 0.0;
  local_f0 = 0.0;
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_68,dVar1,JD);
  (*in_icrs->_vptr_CESkyCoord[3])(&local_e0,in_icrs,&local_68);
  local_d0 = CEAngle::Rad(&local_e0);
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_a8,dVar1,JD);
  (*in_icrs->_vptr_CESkyCoord[4])(&local_c8,in_icrs,&local_a8);
  dVar1 = CEAngle::Rad(&local_c8);
  iauAtci13(local_d0,SUB84(dVar1,0),0,0,0,0,local_b0,local_b8,&local_e8,&local_f0,local_28);
  CEAngle::~CEAngle(&local_c8);
  CEDate::~CEDate(&local_a8);
  CEAngle::~CEAngle(&local_e0);
  CEDate::~CEDate(&local_68);
  CEAngle::Rad((CEAngle *)&local_68,&local_e8);
  CVar2 = CEAngle::Rad((CEAngle *)&local_a8,&local_f0);
  local_e0._vptr_CEAngle._0_4_ = 0;
  (*out_cirs->_vptr_CESkyCoord[5])(CVar2.angle_,out_cirs,&local_68,&local_a8);
  CEAngle::~CEAngle((CEAngle *)&local_a8);
  CEAngle::~CEAngle((CEAngle *)&local_68);
  return;
}

Assistant:

void CESkyCoord::ICRS2CIRS(const CESkyCoord& in_icrs,
                           CESkyCoord*       out_cirs,
                           const CEDate&     date)
{
    // Store the equation of the origins
    double eo; // Equation of the origins
    
    // Use the sofa library to convert these coordinates
    double tdb1(0.0);
    double tdb2(0.0);
    CEDate::UTC2TDB(date.MJD(), &tdb1, &tdb2);
    double return_ra(0.0);
    double return_dec(0.0);
    iauAtci13(in_icrs.XCoord().Rad(), 
                in_icrs.YCoord().Rad(),
                0.0, 0.0, 0.0, 0.0, 
                tdb1, tdb2, 
                &return_ra, &return_dec, &eo);
    
    // Subtract the equation of the origins if J2000 coordinates are desired
    //*return_ra -= eo;

    // Set the output cirs coordinates
    out_cirs->SetCoordinates(CEAngle::Rad(return_ra),
                             CEAngle::Rad(return_dec),
                             CESkyCoordType::CIRS);

    return;
}